

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5Loader.cpp
# Opt level: O2

void __thiscall Assimp::MD5Importer::LoadMD5AnimFile(MD5Importer *this)

{
  undefined8 *puVar1;
  float *pfVar2;
  void *__dest;
  float fVar3;
  double dVar4;
  uint uVar5;
  uint uVar6;
  IOSystem *pIVar7;
  pointer pfVar8;
  undefined1 auVar9 [16];
  MD5Importer *pMVar10;
  pointer pFVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  aiAnimation **ppaVar14;
  aiAnimation *paVar15;
  ulong uVar16;
  aiNodeAnim **ppaVar17;
  aiNodeAnim *paVar18;
  aiVectorKey *paVar19;
  aiQuatKey *paVar20;
  Logger *pLVar21;
  aiNode *paVar22;
  DeadlyImportError *this_00;
  uint i_1;
  long lVar23;
  aiQuatKey *paVar24;
  float *pfVar25;
  pointer pBVar26;
  pointer pFVar27;
  float *pfVar28;
  SkeletonMeshBuilder *pSVar29;
  aiVector3D *paVar30;
  uint i;
  uint uVar31;
  pointer pBVar32;
  ulong uVar33;
  pointer pAVar34;
  undefined4 uVar35;
  undefined4 uVar36;
  allocator<char> local_511;
  IOStream *local_510;
  MD5Importer *local_508;
  aiAnimation *local_500;
  aiVectorKey *local_4f8;
  double local_4f0;
  MD5AnimParser animParser;
  string pFile;
  MD5Parser parser;
  SkeletonMeshBuilder skeleton_maker;
  IOStream *pIVar13;
  
  std::operator+(&pFile,&this->mFile,"md5anim");
  pIVar7 = this->pIOHandler;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&skeleton_maker,"rb",(allocator<char> *)&animParser);
  local_508 = this;
  iVar12 = (*pIVar7->_vptr_IOSystem[4])
                     (pIVar7,pFile._M_dataplus._M_p,
                      skeleton_maker.mVertices.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  pIVar13 = (IOStream *)CONCAT44(extraout_var,iVar12);
  std::__cxx11::string::~string((string *)&skeleton_maker);
  local_510 = pIVar13;
  if ((pIVar13 == (IOStream *)0x0) ||
     (iVar12 = (*pIVar13->_vptr_IOStream[6])(), CONCAT44(extraout_var_00,iVar12) == 0)) {
    pLVar21 = DefaultLogger::get();
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &skeleton_maker,"Failed to read MD5ANIM file: ",&pFile);
    pIVar13 = local_510;
    Logger::warn(pLVar21,(char *)skeleton_maker.mVertices.
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start);
    std::__cxx11::string::~string((string *)&skeleton_maker);
  }
  else {
    LoadFileIntoMemory(local_508,local_510);
    MD5::MD5Parser::MD5Parser(&parser,local_508->mBuffer,local_508->fileSize);
    MD5::MD5AnimParser::MD5AnimParser(&animParser,&parser.mSections);
    pMVar10 = local_508;
    if ((animParser.mAnimatedBones.
         super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>.
         _M_impl.super__Vector_impl_data._M_start ==
         animParser.mAnimatedBones.
         super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>.
         _M_impl.super__Vector_impl_data._M_finish) ||
       ((animParser.mFrames.
         super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>._M_impl
         .super__Vector_impl_data._M_start ==
         animParser.mFrames.
         super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>._M_impl
         .super__Vector_impl_data._M_finish ||
        (((long)animParser.mBaseFrames.
                super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)animParser.mBaseFrames.
               super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0x18 !=
         ((long)animParser.mAnimatedBones.
                super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)animParser.mAnimatedBones.
               super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0x410)))) {
      pLVar21 = DefaultLogger::get();
      Logger::error(pLVar21,"MD5ANIM: No frames or animated bones loaded");
    }
    else {
      local_508->bHadMD5Anim = true;
      local_508->pScene->mNumAnimations = 1;
      ppaVar14 = (aiAnimation **)operator_new__(8);
      pMVar10->pScene->mAnimations = ppaVar14;
      paVar15 = (aiAnimation *)operator_new(0x448);
      aiAnimation::aiAnimation(paVar15);
      *pMVar10->pScene->mAnimations = paVar15;
      uVar16 = ((long)animParser.mAnimatedBones.
                      super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)animParser.mAnimatedBones.
                     super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x410;
      paVar15->mNumChannels = (uint)uVar16;
      ppaVar17 = (aiNodeAnim **)operator_new__((uVar16 & 0xffffffff) << 3);
      paVar15->mChannels = ppaVar17;
      paVar19 = (aiVectorKey *)0x0;
      local_500 = paVar15;
      while (paVar19 < (aiVectorKey *)(uVar16 & 0xffffffff)) {
        local_4f8 = paVar19;
        paVar18 = (aiNodeAnim *)operator_new(0x438);
        (paVar18->mNodeName).length = 0;
        (paVar18->mNodeName).data[0] = '\0';
        memset((paVar18->mNodeName).data + 1,0x1b,0x3ff);
        paVar18->mRotationKeys = (aiQuatKey *)0x0;
        paVar18->mNumScalingKeys = 0;
        *(undefined8 *)&paVar18->mNumPositionKeys = 0;
        *(undefined8 *)((long)&paVar18->mPositionKeys + 4) = 0;
        paVar18->mScalingKeys = (aiVectorKey *)0x0;
        paVar18->mPreState = aiAnimBehaviour_DEFAULT;
        paVar18->mPostState = aiAnimBehaviour_DEFAULT;
        local_500->mChannels[(long)local_4f8] = paVar18;
        uVar31 = animParser.mAnimatedBones.
                 super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)local_4f8].
                 super_BaseJointDescription.mName.length;
        if (0x3fe < uVar31) {
          uVar31 = 0x3ff;
        }
        uVar16 = (ulong)uVar31;
        skeleton_maker.mVertices.
        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(skeleton_maker.mVertices.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,uVar31);
        __dest = (void *)((long)&skeleton_maker.mVertices.
                                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 4);
        memcpy(__dest,animParser.mAnimatedBones.
                      super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)local_4f8].
                      super_BaseJointDescription.mName.data,uVar16);
        *(undefined1 *)
         ((long)&skeleton_maker.mVertices.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar16 + 4) = 0;
        (paVar18->mNodeName).length = uVar31;
        memcpy((paVar18->mNodeName).data,__dest,uVar16);
        pFVar11 = animParser.mFrames.
                  super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pFVar27 = animParser.mFrames.
                  super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar33 = (long)animParser.mFrames.
                       super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)animParser.mFrames.
                       super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = uVar33;
        (paVar18->mNodeName).data[uVar16] = '\0';
        uVar16 = SUB168(auVar9 * ZEXT816(0x18),0);
        if (SUB168(auVar9 * ZEXT816(0x18),8) != 0) {
          uVar16 = 0xffffffffffffffff;
        }
        paVar19 = (aiVectorKey *)operator_new__(uVar16);
        if (pFVar11 != pFVar27) {
          lVar23 = 0;
          do {
            *(undefined4 *)((long)&(paVar19->mValue).z + lVar23) = 0;
            puVar1 = (undefined8 *)((long)&paVar19->mTime + lVar23);
            *puVar1 = 0;
            puVar1[1] = 0;
            lVar23 = lVar23 + 0x18;
          } while (uVar33 * 0x18 - lVar23 != 0);
        }
        paVar18->mPositionKeys = paVar19;
        paVar20 = (aiQuatKey *)operator_new__(uVar16);
        if (pFVar11 != pFVar27) {
          paVar24 = paVar20;
          do {
            paVar24->mTime = 0.0;
            (paVar24->mValue).w = 1.0;
            (paVar24->mValue).x = 0.0;
            (paVar24->mValue).y = 0.0;
            (paVar24->mValue).z = 0.0;
            paVar24 = paVar24 + 1;
          } while (paVar24 != paVar20 + uVar33);
        }
        paVar18->mRotationKeys = paVar20;
        uVar16 = (ulong)local_500->mNumChannels;
        paVar19 = (aiVectorKey *)((long)&local_4f8->mTime + 1);
      }
      local_500->mTicksPerSecond = (double)animParser.fFrameRate;
      for (pFVar27 = animParser.mFrames.
                     super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>
                     ._M_impl.super__Vector_impl_data._M_start; paVar15 = local_500,
          pFVar27 !=
          animParser.mFrames.
          super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>.
          _M_impl.super__Vector_impl_data._M_finish; pFVar27 = pFVar27 + 1) {
        local_4f0 = (double)pFVar27->iIndex;
        if (((pFVar27->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start !=
             (pFVar27->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish) ||
           (pFVar27 ==
            animParser.mFrames.
            super__Vector_base<Assimp::MD5::FrameDesc,_std::allocator<Assimp::MD5::FrameDesc>_>.
            _M_impl.super__Vector_impl_data._M_start)) {
          ppaVar17 = local_500->mChannels;
          pBVar26 = animParser.mBaseFrames.
                    super__Vector_base<Assimp::MD5::BaseFrameDesc,_std::allocator<Assimp::MD5::BaseFrameDesc>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          for (pAVar34 = animParser.mAnimatedBones.
                         super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
                         ._M_impl.super__Vector_impl_data._M_start;
              pAVar34 !=
              animParser.mAnimatedBones.
              super__Vector_base<Assimp::MD5::AnimBoneDesc,_std::allocator<Assimp::MD5::AnimBoneDesc>_>
              ._M_impl.super__Vector_impl_data._M_finish; pAVar34 = pAVar34 + 1) {
            uVar31 = pAVar34->iFirstKeyIndex;
            pfVar8 = (pFVar27->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)uVar31 <
                (ulong)((long)(pFVar27->mValues).super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)pfVar8 >> 2)) {
              paVar18 = *ppaVar17;
              paVar19 = paVar18->mPositionKeys;
              uVar5 = paVar18->mNumPositionKeys;
              paVar18->mNumPositionKeys = uVar5 + 1;
              paVar20 = paVar18->mRotationKeys;
              uVar6 = paVar18->mNumRotationKeys;
              paVar18->mNumRotationKeys = uVar6 + 1;
              skeleton_maker.mVertices.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              pfVar25 = pfVar8 + uVar31;
              skeleton_maker.mVertices.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ = 0;
              local_4f8 = paVar19 + uVar5;
              pfVar2 = &paVar19[uVar5].mValue.y;
              pfVar28 = &paVar19[uVar5].mValue.z;
              for (uVar31 = 0; uVar31 != 3; uVar31 = uVar31 + 1) {
                if ((pAVar34->iFlags >> (uVar31 & 0x1f) & 1) == 0) {
                  pBVar32 = (pointer)&(pBVar26->vPositionXYZ).z;
                  paVar30 = (aiVector3D *)pfVar28;
                  if ((uVar31 != 2) &&
                     (pBVar32 = pBVar26, paVar30 = &paVar19[uVar5].mValue, uVar31 == 1)) {
                    pBVar32 = (pointer)&(pBVar26->vPositionXYZ).y;
                    paVar30 = (aiVector3D *)pfVar2;
                  }
                  paVar30->x = (pBVar32->vPositionXYZ).x;
                }
                else {
                  paVar30 = (aiVector3D *)pfVar28;
                  if ((uVar31 != 2) && (paVar30 = &paVar19[uVar5].mValue, uVar31 == 1)) {
                    paVar30 = (aiVector3D *)pfVar2;
                  }
                  fVar3 = *pfVar25;
                  pfVar25 = pfVar25 + 1;
                  paVar30->x = fVar3;
                }
              }
              for (iVar12 = 0; iVar12 != 3; iVar12 = iVar12 + 1) {
                if ((pAVar34->iFlags >> ((byte)iVar12 & 0x1f) & 8) == 0) {
                  if (iVar12 == 2) {
                    pSVar29 = (SkeletonMeshBuilder *)
                              &skeleton_maker.mVertices.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    paVar30 = (aiVector3D *)&(pBVar26->vRotationQuat).z;
                  }
                  else {
                    paVar30 = &pBVar26->vRotationQuat;
                    pSVar29 = &skeleton_maker;
                    if (iVar12 == 1) {
                      pSVar29 = (SkeletonMeshBuilder *)
                                ((long)&skeleton_maker.mVertices.
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 4);
                      paVar30 = (aiVector3D *)&(pBVar26->vRotationQuat).y;
                    }
                  }
                  *(float *)&(pSVar29->mVertices).
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start = paVar30->x;
                }
                else {
                  if (iVar12 == 2) {
                    pSVar29 = (SkeletonMeshBuilder *)
                              &skeleton_maker.mVertices.
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                  }
                  else {
                    pSVar29 = &skeleton_maker;
                    if (iVar12 == 1) {
                      pSVar29 = (SkeletonMeshBuilder *)
                                ((long)&skeleton_maker.mVertices.
                                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + 4);
                    }
                  }
                  fVar3 = *pfVar25;
                  pfVar25 = pfVar25 + 1;
                  *(float *)&(pSVar29->mVertices).
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start = fVar3;
                }
              }
              MD5::ConvertQuaternion((aiVector3D *)&skeleton_maker,&paVar20[uVar6].mValue);
              local_4f8->mTime = local_4f0;
              paVar20[uVar6].mTime = local_4f0;
            }
            else if (pAVar34->iFlags != 0) {
              this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&skeleton_maker,"MD5: Keyframe index is out of range",&local_511)
              ;
              DeadlyImportError::DeadlyImportError(this_00,(string *)&skeleton_maker);
              __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            ppaVar17 = ppaVar17 + 1;
            pBVar26 = pBVar26 + 1;
          }
        }
        dVar4 = local_500->mDuration;
        uVar35 = SUB84(dVar4,0);
        uVar36 = (undefined4)((ulong)dVar4 >> 0x20);
        if (dVar4 <= local_4f0) {
          uVar35 = SUB84(local_4f0,0);
          uVar36 = (undefined4)((ulong)local_4f0 >> 0x20);
        }
        local_500->mDuration = (double)CONCAT44(uVar36,uVar35);
      }
      if (local_508->pScene->mRootNode == (aiNode *)0x0) {
        paVar22 = (aiNode *)operator_new(0x478);
        aiNode::aiNode(paVar22);
        pMVar10 = local_508;
        local_508->pScene->mRootNode = paVar22;
        aiString::Set(&local_508->pScene->mRootNode->mName,"<MD5_Hierarchy>");
        AttachChilds_Anim(pMVar10,-1,pMVar10->pScene->mRootNode,&animParser.mAnimatedBones,
                          paVar15->mChannels);
        paVar22 = pMVar10->pScene->mRootNode;
        if (paVar22->mNumChildren != 0) {
          SkeletonMeshBuilder::SkeletonMeshBuilder
                    (&skeleton_maker,pMVar10->pScene,*paVar22->mChildren,false);
          SkeletonMeshBuilder::~SkeletonMeshBuilder(&skeleton_maker);
        }
      }
    }
    MD5::MD5AnimParser::~MD5AnimParser(&animParser);
    std::vector<Assimp::MD5::Section,_std::allocator<Assimp::MD5::Section>_>::~vector
              (&parser.mSections);
    pIVar13 = local_510;
  }
  if (pIVar13 != (IOStream *)0x0) {
    (*pIVar13->_vptr_IOStream[1])(pIVar13);
  }
  std::__cxx11::string::~string((string *)&pFile);
  return;
}

Assistant:

void MD5Importer::LoadMD5AnimFile ()
{
    std::string pFile = mFile + "md5anim";
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( !file.get() || !file->FileSize())   {
        ASSIMP_LOG_WARN("Failed to read MD5ANIM file: " + pFile);
        return;
    }
    LoadFileIntoMemory(file.get());

    // parse the basic file structure
    MD5::MD5Parser parser(mBuffer,fileSize);

    // load the animation information from the parse tree
    MD5::MD5AnimParser animParser(parser.mSections);

    // generate and fill the output animation
    if (animParser.mAnimatedBones.empty() || animParser.mFrames.empty() ||
        animParser.mBaseFrames.size() != animParser.mAnimatedBones.size())  {
        ASSIMP_LOG_ERROR("MD5ANIM: No frames or animated bones loaded");
    }
    else {
        bHadMD5Anim = true;

        pScene->mAnimations = new aiAnimation*[pScene->mNumAnimations = 1];
        aiAnimation* anim = pScene->mAnimations[0] = new aiAnimation();
        anim->mNumChannels = (unsigned int)animParser.mAnimatedBones.size();
        anim->mChannels = new aiNodeAnim*[anim->mNumChannels];
        for (unsigned int i = 0; i < anim->mNumChannels;++i)    {
            aiNodeAnim* node = anim->mChannels[i] = new aiNodeAnim();
            node->mNodeName = aiString( animParser.mAnimatedBones[i].mName );

            // allocate storage for the keyframes
            node->mPositionKeys = new aiVectorKey[animParser.mFrames.size()];
            node->mRotationKeys = new aiQuatKey[animParser.mFrames.size()];
        }

        // 1 tick == 1 frame
        anim->mTicksPerSecond = animParser.fFrameRate;

        for (FrameList::const_iterator iter = animParser.mFrames.begin(), iterEnd = animParser.mFrames.end();iter != iterEnd;++iter){
            double dTime = (double)(*iter).iIndex;
            aiNodeAnim** pcAnimNode = anim->mChannels;
            if (!(*iter).mValues.empty() || iter == animParser.mFrames.begin()) /* be sure we have at least one frame */
            {
                // now process all values in there ... read all joints
                MD5::BaseFrameDesc* pcBaseFrame = &animParser.mBaseFrames[0];
                for (AnimBoneList::const_iterator iter2 = animParser.mAnimatedBones.begin(); iter2 != animParser.mAnimatedBones.end();++iter2,
                    ++pcAnimNode,++pcBaseFrame)
                {
                    if((*iter2).iFirstKeyIndex >= (*iter).mValues.size()) {

                        // Allow for empty frames
                        if ((*iter2).iFlags != 0) {
                            throw DeadlyImportError("MD5: Keyframe index is out of range");

                        }
                        continue;
                    }
                    const float* fpCur = &(*iter).mValues[(*iter2).iFirstKeyIndex];
                    aiNodeAnim* pcCurAnimBone = *pcAnimNode;

                    aiVectorKey* vKey = &pcCurAnimBone->mPositionKeys[pcCurAnimBone->mNumPositionKeys++];
                    aiQuatKey* qKey = &pcCurAnimBone->mRotationKeys  [pcCurAnimBone->mNumRotationKeys++];
                    aiVector3D vTemp;

                    // translational component
                    for (unsigned int i = 0; i < 3; ++i) {
                        if ((*iter2).iFlags & (1u << i)) {
                            vKey->mValue[i] =  *fpCur++;
                        }
                        else vKey->mValue[i] = pcBaseFrame->vPositionXYZ[i];
                    }

                    // orientation component
                    for (unsigned int i = 0; i < 3; ++i) {
                        if ((*iter2).iFlags & (8u << i)) {
                            vTemp[i] =  *fpCur++;
                        }
                        else vTemp[i] = pcBaseFrame->vRotationQuat[i];
                    }

                    MD5::ConvertQuaternion(vTemp, qKey->mValue);
                    qKey->mTime = vKey->mTime = dTime;
                }
            }

            // compute the duration of the animation
            anim->mDuration = std::max(dTime,anim->mDuration);
        }

        // If we didn't build the hierarchy yet (== we didn't load a MD5MESH),
        // construct it now from the data given in the MD5ANIM.
        if (!pScene->mRootNode) {
            pScene->mRootNode = new aiNode();
            pScene->mRootNode->mName.Set("<MD5_Hierarchy>");

            AttachChilds_Anim(-1,pScene->mRootNode,animParser.mAnimatedBones,(const aiNodeAnim**)anim->mChannels);

            // Call SkeletonMeshBuilder to construct a mesh to represent the shape
            if (pScene->mRootNode->mNumChildren) {
                SkeletonMeshBuilder skeleton_maker(pScene,pScene->mRootNode->mChildren[0]);
            }
        }
    }
}